

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

void swap_endian(void *data,uint elem_size,uint num)

{
  char cVar1;
  char tmp;
  uint n;
  char *dst;
  char *src;
  uint num_local;
  uint elem_size_local;
  void *data_local;
  
  dst = (char *)((long)data + (ulong)(elem_size - 1));
  src = (char *)data;
  for (num_local = num; num_local != 0; num_local = num_local - 1) {
    for (n = elem_size >> 1; n != 0; n = n - 1) {
      cVar1 = *src;
      *src = *dst;
      *dst = cVar1;
      src = src + 1;
      dst = dst + -1;
    }
    src = src + (elem_size >> 1);
    dst = src + (elem_size - 1);
  }
  return;
}

Assistant:

void swap_endian(void *data, unsigned elem_size, unsigned num)
{
	char *src = (char*) data;
	char *dst = src + (elem_size - 1);

	while(num)
	{
		unsigned n = elem_size>>1;
		char tmp;
		while(n)
		{
			tmp = *src;
			*src = *dst;
			*dst = tmp;

			src++;
			dst--;
			n--;
		}

		src = src + (elem_size>>1);
		dst = src + (elem_size - 1);
		num--;
	}
}